

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv.h
# Opt level: O2

TransformationType get_wmtype(WarpedMotionParams *gm)

{
  TransformationType TVar1;
  
  if ((((gm->wmmat[5] == 0x10000) && (gm->wmmat[4] == 0)) && (gm->wmmat[2] == 0x10000)) &&
     (gm->wmmat[3] == 0)) {
    TVar1 = '\x01';
    if (gm->wmmat[1] == 0) {
      return gm->wmmat[0] != 0;
    }
  }
  else if ((gm->wmmat[2] != gm->wmmat[5]) || (TVar1 = '\x02', gm->wmmat[3] + gm->wmmat[4] != 0)) {
    TVar1 = '\x03';
  }
  return TVar1;
}

Assistant:

static inline TransformationType get_wmtype(const WarpedMotionParams *gm) {
  if (gm->wmmat[5] == (1 << WARPEDMODEL_PREC_BITS) && !gm->wmmat[4] &&
      gm->wmmat[2] == (1 << WARPEDMODEL_PREC_BITS) && !gm->wmmat[3]) {
    return ((!gm->wmmat[1] && !gm->wmmat[0]) ? IDENTITY : TRANSLATION);
  }
  if (gm->wmmat[2] == gm->wmmat[5] && gm->wmmat[3] == -gm->wmmat[4])
    return ROTZOOM;
  else
    return AFFINE;
}